

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O1

void * lj_lightud_intern(lua_State *L,void *p)

{
  byte bVar1;
  uint64_t uVar2;
  uint uVar3;
  uint *p_00;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  void *pvVar9;
  uint uVar10;
  bool bVar11;
  
  uVar2 = (L->glref).ptr64;
  uVar10 = (uint)((ulong)p >> 0x20) & 0xffffff80;
  p_00 = *(uint **)(uVar2 + 0x70);
  bVar1 = *(byte *)(uVar2 + 0x23);
  pvVar5 = (void *)(ulong)bVar1;
  pvVar9 = pvVar5;
  if (p_00 != (uint *)0x0) {
    if (*p_00 == uVar10) {
      uVar8 = 0;
      bVar11 = false;
    }
    else {
      pvVar7 = (void *)0x0;
      do {
        pvVar6 = pvVar7;
        pvVar7 = (void *)((long)pvVar6 + 1);
        if (pvVar7 == (void *)((long)pvVar5 + 1)) {
          bVar11 = pvVar5 <= pvVar6;
          if (0xfd < bVar1) {
            lj_err_msg(L,LJ_ERR_BADLU);
          }
          pvVar9 = (void *)(ulong)(bVar1 + 1);
          goto LAB_00112de7;
        }
      } while (p_00[(long)pvVar7] != uVar10);
      bVar11 = pvVar5 <= pvVar6;
      uVar8 = (long)pvVar7 << 0x27;
    }
    pvVar5 = (void *)((ulong)p & 0x7fffffffff | uVar8);
LAB_00112de7:
    if (!bVar11) {
      return pvVar5;
    }
  }
  uVar3 = (uint)pvVar9;
  if (uVar3 != 1 && (uVar3 & uVar3 - 1) == 0) {
    iVar4 = 2;
    if (uVar3 != 0) {
      iVar4 = uVar3 * 2;
    }
    p_00 = (uint *)lj_mem_realloc(L,p_00,(ulong)(uVar3 * 4),(ulong)(uint)(iVar4 << 2));
    *(uint **)(uVar2 + 0x70) = p_00;
  }
  *(char *)(uVar2 + 0x23) = (char)pvVar9;
  p_00[(long)pvVar9] = uVar10;
  return (void *)((ulong)p & 0x7fffffffff | (long)pvVar9 << 0x27);
}

Assistant:

void *lj_lightud_intern(lua_State *L, void *p)
{
  global_State *g = G(L);
  uint64_t u = (uint64_t)p;
  uint32_t up = lightudup(u);
  uint32_t *segmap = mref(g->gc.lightudseg, uint32_t);
  MSize segnum = g->gc.lightudnum;
  if (segmap) {
    MSize seg;
    for (seg = 0; seg <= segnum; seg++)
      if (segmap[seg] == up)  /* Fast path. */
	return (void *)(((uint64_t)seg << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
    segnum++;
    /* Leave last segment unused to avoid clash with ITERN key. */
    if (segnum >= (1 << LJ_LIGHTUD_BITS_SEG)-1) lj_err_msg(L, LJ_ERR_BADLU);
  }
  if (!((segnum-1) & segnum) && segnum != 1) {
    lj_mem_reallocvec(L, segmap, segnum, segnum ? 2*segnum : 2u, uint32_t);
    setmref(g->gc.lightudseg, segmap);
  }
  g->gc.lightudnum = segnum;
  segmap[segnum] = up;
  return (void *)(((uint64_t)segnum << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
}